

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall crnlib::dxt_image::has_alpha(dxt_image *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  dxt1_block *this_00;
  long in_RDI;
  uint x;
  uint y;
  dxt1_block *blk;
  uint i;
  uint local_28;
  uint local_24;
  uint local_14;
  
  iVar1 = *(int *)(in_RDI + 0x44);
  if (iVar1 == 0) {
    for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0x2c); local_14 = local_14 + 1) {
      this_00 = (dxt1_block *)(*(long *)(in_RDI + 0x10) + (ulong)local_14 * 8);
      uVar2 = dxt1_block::get_low_color(this_00);
      uVar3 = dxt1_block::get_high_color(this_00);
      if (uVar2 <= uVar3) {
        for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
          for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
            uVar2 = dxt1_block::get_selector(this_00,local_28,local_24);
            if (uVar2 == 3) {
              return true;
            }
          }
        }
      }
    }
  }
  else if (((iVar1 - 1U < 4) || (iVar1 == 9)) || (iVar1 == 0xb)) {
    return true;
  }
  return false;
}

Assistant:

bool dxt_image::has_alpha() const {
  switch (m_format) {
    case cDXT1: {
      for (uint i = 0; i < m_total_elements; i++) {
        const dxt1_block& blk = *(dxt1_block*)&m_pElements[i];

        if (blk.get_low_color() <= blk.get_high_color()) {
          for (uint y = 0; y < cDXTBlockSize; y++)
            for (uint x = 0; x < cDXTBlockSize; x++)
              if (blk.get_selector(x, y) == 3)
                return true;
        }
      }

      break;
    }
    case cDXT1A:
    case cDXT3:
    case cDXT5:
    case cDXT5A:
    case cETC2A:
    case cETC2AS:
      return true;
    default:
      break;
  }

  return false;
}